

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O0

Expression * __thiscall wasm::DataFlow::Graph::makeUse(Graph *this,Node *node)

{
  Index IVar1;
  Name target;
  bool bVar2;
  Const *pCVar3;
  LocalSet *pLVar4;
  reference ppNVar5;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_a8;
  size_t local_88;
  char *pcStack_80;
  Builder local_70;
  uintptr_t local_68;
  Index local_60;
  Index index_1;
  Literal local_50;
  uintptr_t local_38;
  Index local_2c;
  Index index;
  Builder builder;
  Node *node_local;
  Graph *this_local;
  
  builder.wasm = (Module *)node;
  Builder::Builder((Builder *)&stack0xffffffffffffffd8,this->module);
  bVar2 = Node::isPhi((Node *)builder.wasm);
  if (bVar2) {
    IVar1 = *(Index *)&((builder.wasm)->exports).
                       super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
    local_2c = IVar1;
    local_38 = (uintptr_t)Function::getLocalType(this->func,IVar1);
    this_local = (Graph *)Builder::makeLocalGet
                                    ((Builder *)&stack0xffffffffffffffd8,IVar1,(Type)local_38);
  }
  else {
    bVar2 = Node::isConst((Node *)builder.wasm);
    if (bVar2) {
      pCVar3 = Expression::cast<wasm::Const>
                         ((Expression *)
                          ((builder.wasm)->exports).
                          super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
      wasm::Literal::Literal(&local_50,&pCVar3->value);
      this_local = (Graph *)Builder::makeConst((Builder *)&stack0xffffffffffffffd8,&local_50);
      wasm::Literal::~Literal(&local_50);
    }
    else {
      bVar2 = Node::isExpr((Node *)builder.wasm);
      if (bVar2) {
        pLVar4 = getSet(this,(Node *)builder.wasm);
        IVar1 = pLVar4->index;
        local_60 = IVar1;
        local_68 = (uintptr_t)Function::getLocalType(this->func,IVar1);
        this_local = (Graph *)Builder::makeLocalGet
                                        ((Builder *)&stack0xffffffffffffffd8,IVar1,(Type)local_68);
      }
      else {
        bVar2 = Node::isZext((Node *)builder.wasm);
        if (bVar2) {
          ppNVar5 = std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::
                    operator[]((vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                                *)&(builder.wasm)->functions,0);
          this_local = (Graph *)makeUse(this,*ppNVar5);
        }
        else {
          bVar2 = Node::isVar((Node *)builder.wasm);
          if (!bVar2) {
            handle_unreachable("unexpected node type",
                               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/dataflow/graph.h"
                               ,0x317);
          }
          Builder::Builder(&local_70,this->module);
          local_88 = (this->FAKE_CALL).super_IString.str._M_len;
          pcStack_80 = (this->FAKE_CALL).super_IString.str._M_str;
          local_a8.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_a8.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_a8.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector(&local_a8);
          target.super_IString.str._M_str = pcStack_80;
          target.super_IString.str._M_len = local_88;
          this_local = (Graph *)Builder::makeCall(&local_70,target,&local_a8,
                                                  (Type)((builder.wasm)->exports).
                                                                                                                
                                                  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish,false);
          std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector(&local_a8);
        }
      }
    }
  }
  return (Expression *)this_local;
}

Assistant:

Expression* makeUse(Node* node) {
    Builder builder(*module);
    if (node->isPhi()) {
      // The index is the wasm local that we assign to when implementing
      // the phi; get from there.
      auto index = node->index;
      return builder.makeLocalGet(index, func->getLocalType(index));
    } else if (node->isConst()) {
      return builder.makeConst(node->expr->cast<Const>()->value);
    } else if (node->isExpr()) {
      // Find the set we are a value of.
      auto index = getSet(node)->index;
      return builder.makeLocalGet(index, func->getLocalType(index));
    } else if (node->isZext()) {
      // i1 zexts are a no-op for wasm
      return makeUse(node->values[0]);
    } else if (node->isVar()) {
      // Nothing valid for us to read here. Emit a call, representing an unknown
      // variable value.
      return Builder(*module).makeCall(FAKE_CALL, {}, node->wasmType);
    } else {
      WASM_UNREACHABLE("unexpected node type"); // TODO
    }
  }